

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# component.cpp
# Opt level: O0

bool __thiscall
libcellml::Component::ComponentImpl::equalResets(ComponentImpl *this,ComponentPtr *other)

{
  bool bVar1;
  shared_ptr<libcellml::Entity> local_70;
  vector<std::shared_ptr<libcellml::Entity>,_std::allocator<std::shared_ptr<libcellml::Entity>_>_>
  *local_60;
  vector<std::shared_ptr<libcellml::Entity>,_std::allocator<std::shared_ptr<libcellml::Entity>_>_>
  *local_48;
  __normal_iterator<const_std::shared_ptr<libcellml::Reset>_*,_std::vector<std::shared_ptr<libcellml::Reset>,_std::allocator<std::shared_ptr<libcellml::Reset>_>_>_>
  local_40;
  __normal_iterator<const_std::shared_ptr<libcellml::Reset>_*,_std::vector<std::shared_ptr<libcellml::Reset>,_std::allocator<std::shared_ptr<libcellml::Reset>_>_>_>
  local_38;
  undefined1 local_30 [8];
  vector<std::shared_ptr<libcellml::Entity>,_std::allocator<std::shared_ptr<libcellml::Entity>_>_>
  entities;
  ComponentPtr *other_local;
  ComponentImpl *this_local;
  
  entities.
  super__Vector_base<std::shared_ptr<libcellml::Entity>,_std::allocator<std::shared_ptr<libcellml::Entity>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)other;
  std::
  vector<std::shared_ptr<libcellml::Entity>,_std::allocator<std::shared_ptr<libcellml::Entity>_>_>::
  vector((vector<std::shared_ptr<libcellml::Entity>,_std::allocator<std::shared_ptr<libcellml::Entity>_>_>
          *)local_30);
  local_38._M_current =
       (shared_ptr<libcellml::Reset> *)
       std::
       vector<std::shared_ptr<libcellml::Reset>,_std::allocator<std::shared_ptr<libcellml::Reset>_>_>
       ::begin(&this->mResets);
  local_40._M_current =
       (shared_ptr<libcellml::Reset> *)
       std::
       vector<std::shared_ptr<libcellml::Reset>,_std::allocator<std::shared_ptr<libcellml::Reset>_>_>
       ::end(&this->mResets);
  local_48 = (vector<std::shared_ptr<libcellml::Entity>,_std::allocator<std::shared_ptr<libcellml::Entity>_>_>
              *)std::
                back_inserter<std::vector<std::shared_ptr<libcellml::Entity>,std::allocator<std::shared_ptr<libcellml::Entity>>>>
                          ((vector<std::shared_ptr<libcellml::Entity>,_std::allocator<std::shared_ptr<libcellml::Entity>_>_>
                            *)local_30);
  local_60 = (vector<std::shared_ptr<libcellml::Entity>,_std::allocator<std::shared_ptr<libcellml::Entity>_>_>
              *)std::
                copy<__gnu_cxx::__normal_iterator<std::shared_ptr<libcellml::Reset>const*,std::vector<std::shared_ptr<libcellml::Reset>,std::allocator<std::shared_ptr<libcellml::Reset>>>>,std::back_insert_iterator<std::vector<std::shared_ptr<libcellml::Entity>,std::allocator<std::shared_ptr<libcellml::Entity>>>>>
                          (local_38,local_40,
                           (back_insert_iterator<std::vector<std::shared_ptr<libcellml::Entity>,_std::allocator<std::shared_ptr<libcellml::Entity>_>_>_>
                            )local_48);
  std::shared_ptr<libcellml::Entity>::shared_ptr<libcellml::Component,void>
            (&local_70,
             (shared_ptr<libcellml::Component> *)
             entities.
             super__Vector_base<std::shared_ptr<libcellml::Entity>,_std::allocator<std::shared_ptr<libcellml::Entity>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage);
  bVar1 = equalEntities(&local_70,
                        (vector<std::shared_ptr<libcellml::Entity>,_std::allocator<std::shared_ptr<libcellml::Entity>_>_>
                         *)local_30);
  std::shared_ptr<libcellml::Entity>::~shared_ptr(&local_70);
  std::
  vector<std::shared_ptr<libcellml::Entity>,_std::allocator<std::shared_ptr<libcellml::Entity>_>_>::
  ~vector((vector<std::shared_ptr<libcellml::Entity>,_std::allocator<std::shared_ptr<libcellml::Entity>_>_>
           *)local_30);
  return bVar1;
}

Assistant:

bool Component::ComponentImpl::equalResets(const ComponentPtr &other) const
{
    std::vector<EntityPtr> entities;
    std::copy(mResets.begin(), mResets.end(), std::back_inserter(entities));
    return equalEntities(other, entities);
}